

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BOOL VIRTUALInitialize(void)

{
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  InternalInitializeCriticalSection(&virtual_critsec);
  pVirtualMemory = (PCMI)0x0;
  pVirtualMemoryLastFound = (PCMI)0x0;
  return 1;
}

Assistant:

BOOL
VIRTUALInitialize( void )
{
    TRACE( "Initializing the Virtual Critical Sections. \n" );

    InternalInitializeCriticalSection(&virtual_critsec);

    pVirtualMemory = NULL;
    pVirtualMemoryLastFound = NULL;

    return TRUE;
}